

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  void *idle_data_local;
  _func_void_void_ptr *idle_proc_local;
  
  if (arg_simple_interface) {
    simple_interface_exec(idle_proc,idle_data);
  }
  else {
    curses_interface_exec(idle_proc,idle_data);
  }
  return;
}

Assistant:

void interface_exec(void(*idle_proc)(void *), void *idle_data)
{
#if defined(ADLJACK_USE_CURSES)
    if (arg_simple_interface)
        simple_interface_exec(idle_proc, idle_data);
    else
        curses_interface_exec(idle_proc, idle_data);
#else
    simple_interface_exec();
#endif
}